

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FramebufferGLImpl.cpp
# Opt level: O3

bool Diligent::UseDefaultFBO
               (Uint32 NumRenderTargets,TextureViewGLImpl **ppRTVs,TextureViewGLImpl *pDSV)

{
  bool bVar1;
  bool bVar2;
  GLTextureObj *pGVar3;
  ulong uVar4;
  
  if (NumRenderTargets == 0) {
    bVar1 = false;
  }
  else {
    uVar4 = 0;
    bVar1 = false;
    do {
      if ((ppRTVs[uVar4] != (TextureViewGLImpl *)0x0) &&
         (pGVar3 = TextureViewGLImpl::GetHandle(ppRTVs[uVar4]), pGVar3->m_uiHandle == 0)) {
        if (uVar4 == 0) {
          bVar1 = true;
        }
        else {
          LogError<true,char[136]>
                    (false,"UseDefaultFBO",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/FramebufferGLImpl.cpp"
                     ,0x37,(char (*) [136])
                           "In OpenGL, swap chain back buffer can be the only render target in the framebuffer and cannot be combined with any other render target."
                    );
        }
      }
      uVar4 = uVar4 + 1;
    } while (NumRenderTargets != uVar4);
  }
  bVar2 = bVar1;
  if (pDSV != (TextureViewGLImpl *)0x0) {
    if ((bVar1) && (pGVar3 = TextureViewGLImpl::GetHandle(pDSV), pGVar3->m_uiHandle != 0)) {
      LogError<true,char[92]>
                (false,"UseDefaultFBO",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/FramebufferGLImpl.cpp"
                 ,0x40,(char (*) [92])
                       "In OpenGL, swap chain back buffer can only be paired with the default depth-stencil buffer."
                );
    }
    pGVar3 = TextureViewGLImpl::GetHandle(pDSV);
    if ((pGVar3->m_uiHandle == 0) && (bVar2 = true, !(bool)(NumRenderTargets == 0 | bVar1))) {
      LogError<true,char[90]>
                (false,"UseDefaultFBO",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/FramebufferGLImpl.cpp"
                 ,0x47,(char (*) [90])
                       "In OpenGL, the swap chain\'s depth-stencil buffer can only be paired with its back buffer."
                );
      bVar2 = bVar1;
    }
  }
  return bVar2;
}

Assistant:

static bool UseDefaultFBO(Uint32             NumRenderTargets,
                          TextureViewGLImpl* ppRTVs[],
                          TextureViewGLImpl* pDSV)
{
    bool useDefaultFBO = false;
    for (Uint32 rt = 0; rt < NumRenderTargets; ++rt)
    {
        if (ppRTVs[rt] != nullptr && ppRTVs[rt]->GetHandle() == 0)
        {
            if (rt == 0)
            {
                useDefaultFBO = true;
            }
            else
            {
                LOG_ERROR_AND_THROW("In OpenGL, swap chain back buffer can be the only render target in the framebuffer "
                                    "and cannot be combined with any other render target.");
            }
        }
    }

    if (pDSV != nullptr)
    {
        if (useDefaultFBO && pDSV->GetHandle() != 0)
        {
            LOG_ERROR_AND_THROW("In OpenGL, swap chain back buffer can only be paired with the default depth-stencil buffer.");
        }

        if (pDSV->GetHandle() == 0)
        {
            if (!useDefaultFBO && NumRenderTargets > 0)
            {
                LOG_ERROR_AND_THROW("In OpenGL, the swap chain's depth-stencil buffer can only be paired with its back buffer.");
            }
            else
            {
                useDefaultFBO = true;
            }
        }
    }

    return useDefaultFBO;
}